

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

void arrangeQuoters_superFast_lessThen5
               (word *pInOut,int start,int iQ,int jQ,int kQ,int lQ,int iVar,int nWords,
               char *pCanonPerm,uint *pCanonPhase)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  if (-1 < start) {
    bVar8 = (byte)iVar;
    iVar12 = iQ << (bVar8 & 0x1f);
    iVar9 = jQ << (bVar8 & 0x1f);
    iVar14 = kQ << (bVar8 & 0x1f);
    iVar15 = lQ << (bVar8 & 0x1f);
    iVar13 = 3 << (bVar8 & 0x1f);
    if (0x3f < iVar12) {
      __assert_fail("iQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6c,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar9) {
      __assert_fail("jQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6d,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar14) {
      __assert_fail("kQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6e,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar15) {
      __assert_fail("lQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6f,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar13) {
      __assert_fail("3*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x70,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    uVar1 = SFmask[iVar][iQ];
    uVar2 = SFmask[iVar][jQ];
    uVar3 = SFmask[iVar][kQ];
    uVar4 = SFmask[iVar][lQ];
    lVar10 = (ulong)(uint)start + 1;
    do {
      uVar5 = pInOut[lVar10 + -1];
      pInOut[lVar10 + -1] =
           ((uVar5 & uVar4) << ((byte)iVar15 & 0x3f)) >> ((byte)iVar13 & 0x3f) |
           ((uVar3 & uVar5) << ((byte)iVar14 & 0x3f)) >> ((byte)(2 << (bVar8 & 0x1f)) & 0x3f) |
           ((uVar2 & uVar5) << ((byte)iVar9 & 0x3f)) >> ((byte)(1 << (bVar8 & 0x1f)) & 0x3f) |
           (uVar1 & uVar5) << ((byte)iVar12 & 0x3f);
      lVar11 = lVar10 + -1;
      bVar6 = 0 < lVar10;
      lVar10 = lVar11;
    } while (lVar11 != 0 && bVar6);
  }
  iVar12 = iQ - jQ;
  iVar9 = -iVar12;
  if (0 < iVar12) {
    iVar9 = iVar12;
  }
  uVar7 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,(iQ + iVar9 * 4) - 4);
  *pCanonPhase = uVar7;
  return;
}

Assistant:

void arrangeQuoters_superFast_lessThen5(word* pInOut, int start, int iQ, int jQ, int kQ, int lQ, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i, blockSize = 1<<iVar;
//     printf("in arrangeQuoters_superFast_lessThen5\n");
//     printf("start = %d, iQ = %d,jQ = %d,kQ = %d,lQ = %d, iVar = %d, nWords = %d\n", start, iQ, jQ, kQ , lQ, iVar, nWords);
    for(i=start;i>=0;i--)
    {   
        assert( iQ*blockSize < 64 );
        assert( jQ*blockSize < 64 );
        assert( kQ*blockSize < 64 );
        assert( lQ*blockSize < 64 );
        assert( 3*blockSize < 64 );
        pInOut[i] = (pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize) |
            (((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize))>>blockSize) |
            (((pInOut[i] & SFmask[iVar][kQ])<<(kQ*blockSize))>>2*blockSize) |
            (((pInOut[i] & SFmask[iVar][lQ])<<(lQ*blockSize))>>3*blockSize);
    }
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//     printf("out arrangeQuoters_superFast_lessThen5\n");

}